

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O1

int32_t ucnv_fromUCountPending_63(UConverter *cnv,UErrorCode *status)

{
  if ((status == (UErrorCode *)0x0) || (U_ZERO_ERROR < *status)) {
    return -1;
  }
  if (cnv == (UConverter *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
  }
  if (-1 < cnv->preFromUFirstCP) {
    return ((int)cnv->preFromULength - (uint)((uint)cnv->preFromUFirstCP < 0x10000)) + 2;
  }
  if (-1 < cnv->preFromULength) {
    return (uint)(0 < cnv->fromUChar32);
  }
  return -(int)cnv->preFromULength;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_fromUCountPending(const UConverter* cnv, UErrorCode* status)
{
    if(status == NULL || U_FAILURE(*status)){
        return -1;
    }
    if(cnv == NULL){
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return -1;
    }

    if(cnv->preFromUFirstCP >= 0){
        return U16_LENGTH(cnv->preFromUFirstCP)+cnv->preFromULength ;
    }else if(cnv->preFromULength < 0){
        return -cnv->preFromULength ;
    }else if(cnv->fromUChar32 > 0){
        return 1;
    }
    return 0; 

}